

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

ssize_t __thiscall vkt::Draw::Image::read(Image *this,int __fd,void *__buf,size_t __nbytes)

{
  Image *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  int in_R8D;
  int in_R9D;
  VkOffset3D offset;
  int in_stack_00000008;
  int in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  VkImageAspectFlagBits in_stack_00000028;
  VkImageType in_stack_00000030;
  void *in_stack_00000040;
  VkOffset3D zeroOffset;
  undefined1 local_78 [8];
  SharedPtr<vkt::Draw::Image> stagingResource;
  VkImageLayout layout_local;
  Allocator *allocator_local;
  VkQueue queue_local;
  Image *this_local;
  VkOffset3D offset_local;
  
  stagingResource.m_state._4_4_ = (undefined4)__nbytes;
  offset._0_8_ = __nbytes & 0xffffffff;
  offset.z = in_stack_00000008;
  copyToLinearImage((Image *)local_78,(VkQueue)this,(Allocator *)CONCAT44(in_register_00000034,__fd)
                    ,(VkImageLayout)__buf,offset,in_R8D,in_R9D,in_stack_00000010,in_stack_00000018,
                    in_stack_00000020,in_stack_00000028,in_stack_00000030);
  this_00 = de::SharedPtr<vkt::Draw::Image>::operator->((SharedPtr<vkt::Draw::Image> *)local_78);
  readLinear(this_00,(VkOffset3D)ZEXT812(0),in_stack_00000008,in_stack_00000010,in_stack_00000018,0,
             0,in_stack_00000030,in_stack_00000040);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)local_78);
  return extraout_RAX;
}

Assistant:

void Image::read (vk::VkQueue					queue,
				  vk::Allocator&				allocator,
				  vk::VkImageLayout				layout,
				  vk::VkOffset3D				offset,
				  int							width,
				  int							height,
				  int							depth,
				  unsigned int					mipLevel,
				  unsigned int					arrayElement,
				  vk::VkImageAspectFlagBits		aspect,
				  vk::VkImageType				type,
				  void *						data)
{
	DE_ASSERT(layout == vk::VK_IMAGE_LAYOUT_GENERAL || layout == vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);

	de::SharedPtr<Image> stagingResource = copyToLinearImage(queue, allocator, layout, offset, width,
															 height, depth, mipLevel, arrayElement, aspect, type);
	const vk::VkOffset3D zeroOffset = {0, 0, 0};
	stagingResource->readLinear(zeroOffset, width, height, depth, 0, 0, aspect, data);
}